

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

bool __thiscall wabt::Decompiler::ConstIntVal(Decompiler *this,Expr *e,uint64_t *dest)

{
  ExprType EVar1;
  Enum EVar2;
  uint32_t uVar3;
  ConstExpr *pCVar4;
  bool bVar5;
  char *local_48;
  Type local_3c;
  Type local_38;
  Type local_34;
  Const *local_30;
  Const *c;
  uint64_t *dest_local;
  Expr *e_local;
  Decompiler *this_local;
  
  *dest = 0;
  if ((e == (Expr *)0x0) ||
     (c = (Const *)dest, dest_local = (uint64_t *)e, e_local = (Expr *)this, EVar1 = Expr::type(e),
     EVar1 != Const)) {
    return false;
  }
  pCVar4 = cast<wabt::ConstExpr,wabt::Expr>((Expr *)dest_local);
  local_30 = &pCVar4->const_;
  local_34 = Const::type(local_30);
  EVar2 = Type::operator_cast_to_Enum(&local_34);
  bVar5 = false;
  if (EVar2 != I32) {
    local_38 = Const::type(local_30);
    EVar2 = Type::operator_cast_to_Enum(&local_38);
    bVar5 = EVar2 != I64;
  }
  if (!bVar5) {
    local_3c = Const::type(local_30);
    EVar2 = Type::operator_cast_to_Enum(&local_3c);
    if (EVar2 == I32) {
      uVar3 = Const::u32(local_30);
      local_48 = (char *)(ulong)uVar3;
    }
    else {
      local_48 = (char *)Const::u64(local_30);
    }
    (c->loc).filename.data_ = local_48;
    return true;
  }
  return false;
}

Assistant:

bool ConstIntVal(const Expr* e, uint64_t &dest) {
    dest = 0;
    if (!e || e->type() != ExprType::Const) return false;
    auto& c = cast<ConstExpr>(e)->const_;
    if (c.type() != Type::I32 && c.type() != Type::I64) return false;
    dest = c.type() == Type::I32 ? c.u32() : c.u64();
    return true;
  }